

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O3

void __thiscall BamTools::ConvertTool::~ConvertTool(ConvertTool *this)

{
  ~ConvertTool(this);
  operator_delete(this);
  return;
}

Assistant:

ConvertTool::~ConvertTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}